

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<long_double,_1000> * __thiscall
TPZManVector<long_double,_1000>::operator=
          (TPZManVector<long_double,_1000> *this,TPZManVector<long_double,_1000> *copy)

{
  longdouble *plVar1;
  long lVar2;
  longdouble *plVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this == copy) {
    return this;
  }
  uVar5 = (copy->super_TPZVec<long_double>).fNElements;
  lVar2 = (this->super_TPZVec<long_double>).fNAlloc;
  if ((lVar2 < (long)uVar5) &&
     (plVar3 = (this->super_TPZVec<long_double>).fStore,
     plVar3 != this->fExtAlloc && plVar3 != (longdouble *)0x0)) {
    operator_delete__(plVar3);
    (this->super_TPZVec<long_double>).fStore = (longdouble *)0x0;
    (this->super_TPZVec<long_double>).fNAlloc = 0;
    lVar2 = 0;
  }
  if ((long)uVar5 < 0x3e9) {
    plVar1 = (this->super_TPZVec<long_double>).fStore;
    plVar3 = this->fExtAlloc;
    if (plVar1 != (longdouble *)0x0 && plVar1 != plVar3) {
      operator_delete__(plVar1);
    }
    (this->super_TPZVec<long_double>).fNAlloc = 0;
    (this->super_TPZVec<long_double>).fStore = plVar3;
  }
  else {
    if ((long)uVar5 <= lVar2) {
      (this->super_TPZVec<long_double>).fNElements = uVar5;
      plVar3 = (this->super_TPZVec<long_double>).fStore;
      goto LAB_0116ade0;
    }
    plVar3 = (longdouble *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 << 4);
    (this->super_TPZVec<long_double>).fStore = plVar3;
    (this->super_TPZVec<long_double>).fNAlloc = uVar5;
  }
  (this->super_TPZVec<long_double>).fNElements = uVar5;
LAB_0116ade0:
  plVar1 = (copy->super_TPZVec<long_double>).fStore;
  uVar4 = 0;
  if ((long)uVar5 < 1) {
    uVar5 = uVar4;
  }
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    *(unkbyte10 *)((long)plVar3 + uVar4) = *(unkbyte10 *)((long)plVar1 + uVar4);
    uVar4 = uVar4 + 0x10;
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}